

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double cosine_cdf_inv(double cdf,double a,double b)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if ((cdf < 0.0) || (1.0 < cdf)) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"COSINE_CDF_INV - Fatal error!\n");
    pcVar2 = "  CDF < 0 or 1 < CDF.\n";
LAB_00197fd9:
    std::operator<<((ostream *)&std::cerr,pcVar2);
    exit(1);
  }
  if ((cdf != 0.0) || (NAN(cdf))) {
    if ((cdf != 1.0) || (NAN(cdf))) {
      dVar6 = b * -3.141592653589793 + a;
      dVar7 = b * 3.141592653589793 + a;
      dVar5 = 0.0;
      iVar1 = 100;
      dVar8 = dVar6;
      dVar10 = dVar7;
      do {
        dVar9 = (dVar8 + dVar10) * 0.5;
        dVar3 = 0.0;
        if (dVar6 < dVar9) {
          if (dVar9 <= dVar7) {
            dVar3 = (dVar9 - a) / b;
            dVar4 = sin(dVar3);
            dVar3 = (dVar4 + dVar3) / 6.283185307179586 + 0.5;
          }
          else if (dVar7 < dVar9) {
            dVar3 = 1.0;
          }
        }
        if (ABS(dVar3 - cdf) < 0.0001) {
          return dVar9;
        }
        if (((dVar3 <= cdf) && (dVar5 <= cdf)) || ((cdf <= dVar3 && (cdf <= dVar5)))) {
          dVar5 = dVar3;
          dVar8 = dVar9;
          dVar9 = dVar10;
        }
        iVar1 = iVar1 + -1;
        dVar10 = dVar9;
      } while (iVar1 != 0);
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"COSINE_CDF_INV - Fatal error!\n");
      pcVar2 = "  Iteration limit exceeded.\n";
      goto LAB_00197fd9;
    }
    dVar5 = b * 3.141592653589793;
  }
  else {
    dVar5 = b * -3.141592653589793;
  }
  return dVar5 + a;
}

Assistant:

double cosine_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_CDF_INV inverts the Cosine CDF.
//
//  Discussion:
//
//    A simple bisection method is used on the interval
//    [ A - PI * B, A + PI * B ].
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double COSINE_CDF_INV, the corresponding argument of the CDF.
//
{
  double cdf1;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_pi = 3.14159265358979323;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "COSINE_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = a - r8_pi * b;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = a + r8_pi * b;
    return x;
  }

  x1 = a - r8_pi * b;
  cdf1 = 0.0;

  x2 = a + r8_pi * b;
//
//  Now use bisection.
//
  it = 0;

  for ( it = 1; it <= it_max; it++ )
  {
    x3 = 0.5 * ( x1 + x2 );
    cdf3 = cosine_cdf ( x3, a, b );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      return x;
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
    }

  }

  cerr << " \n";
  cerr << "COSINE_CDF_INV - Fatal error!\n";
  cerr << "  Iteration limit exceeded.\n";
  exit ( 1 );
}